

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timDump.c
# Opt level: O2

Vec_Str_t * Tim_ManSave(Tim_Man_t *p,int fHieOnly)

{
  Tim_Obj_t *pTVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Vec_Str_t *vOut;
  char *pcVar5;
  int *piVar6;
  float *pfVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  float fVar11;
  
  vOut = (Vec_Str_t *)malloc(0x10);
  vOut->nCap = 10000;
  vOut->nSize = 0;
  pcVar5 = (char *)malloc(10000);
  vOut->pArray = pcVar5;
  Vec_StrPutI_ne(vOut,1);
  iVar3 = Tim_ManCiNum(p);
  Vec_StrPutI_ne(vOut,iVar3);
  iVar3 = Tim_ManCoNum(p);
  Vec_StrPutI_ne(vOut,iVar3);
  iVar3 = Tim_ManPiNum(p);
  Vec_StrPutI_ne(vOut,iVar3);
  iVar3 = Tim_ManPoNum(p);
  Vec_StrPutI_ne(vOut,iVar3);
  iVar3 = Tim_ManBoxNum(p);
  Vec_StrPutI_ne(vOut,iVar3);
  iVar3 = Tim_ManBoxNum(p);
  if (0 < iVar3) {
    for (iVar3 = 0; iVar3 < p->vBoxes->nSize; iVar3 = iVar3 + 1) {
      piVar6 = (int *)Vec_PtrEntry(p->vBoxes,iVar3);
      iVar4 = Tim_ManBoxInputNum(p,*piVar6);
      Vec_StrPutI_ne(vOut,iVar4);
      iVar4 = Tim_ManBoxOutputNum(p,*piVar6);
      Vec_StrPutI_ne(vOut,iVar4);
      iVar4 = Tim_ManBoxDelayTableId(p,*piVar6);
      Vec_StrPutI_ne(vOut,iVar4);
      iVar4 = Tim_ManBoxCopy(p,*piVar6);
      Vec_StrPutI_ne(vOut,iVar4);
    }
  }
  if (fHieOnly == 0) {
    iVar3 = Tim_ManDelayTableNum(p);
    Vec_StrPutI_ne(vOut,iVar3);
    iVar3 = Tim_ManDelayTableNum(p);
    if (0 < iVar3) {
      for (iVar3 = 0; iVar3 < p->vDelayTables->nSize; iVar3 = iVar3 + 1) {
        pfVar7 = (float *)Vec_PtrEntry(p->vDelayTables,iVar3);
        if (iVar3 != (int)*pfVar7) {
          __assert_fail("(int)pDelayTable[0] == i",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/tim/timDump.c"
                        ,0x53,"Vec_Str_t *Tim_ManSave(Tim_Man_t *, int)");
        }
        Vec_StrPutI_ne(vOut,iVar3);
        Vec_StrPutI_ne(vOut,(int)pfVar7[1]);
        Vec_StrPutI_ne(vOut,(int)pfVar7[2]);
        uVar2 = (int)pfVar7[2] * (int)pfVar7[1];
        if ((int)pfVar7[2] * (int)pfVar7[1] < 1) {
          uVar2 = 0;
        }
        for (uVar8 = 0; uVar2 != uVar8; uVar8 = uVar8 + 1) {
          Vec_StrPutF(vOut,pfVar7[uVar8 + 3]);
        }
      }
    }
    lVar10 = 8;
    lVar9 = 0;
    while ((lVar9 < p->nCis && (pTVar1 = p->pCis, pTVar1 != (Tim_Obj_t *)0x0))) {
      if (*(int *)((long)&pTVar1->Id + lVar10) < 0) {
        fVar11 = Tim_ManGetCiArrival(p,*(int *)((long)pTVar1 + lVar10 + -8));
        Vec_StrPutF(vOut,fVar11);
      }
      lVar9 = lVar9 + 1;
      lVar10 = lVar10 + 0x18;
    }
    lVar10 = 8;
    lVar9 = 0;
    while ((lVar9 < p->nCos && (pTVar1 = p->pCos, pTVar1 != (Tim_Obj_t *)0x0))) {
      if (*(int *)((long)&pTVar1->Id + lVar10) < 0) {
        fVar11 = Tim_ManGetCoRequired(p,*(int *)((long)pTVar1 + lVar10 + -8));
        Vec_StrPutF(vOut,fVar11);
      }
      lVar9 = lVar9 + 1;
      lVar10 = lVar10 + 0x18;
    }
  }
  return vOut;
}

Assistant:

Vec_Str_t * Tim_ManSave( Tim_Man_t * p, int fHieOnly )
{
    Tim_Box_t * pBox;
    Tim_Obj_t * pObj;
    Vec_Str_t * vStr;
    float * pDelayTable;
    int i, k, TableSize;
    // create output stream
    vStr = Vec_StrAlloc( 10000 );
    // dump version number
    Vec_StrPutI_ne( vStr, TIM_DUMP_VER_NUM );
    // save CI/CO counts
    Vec_StrPutI_ne( vStr, Tim_ManCiNum(p) );
    Vec_StrPutI_ne( vStr, Tim_ManCoNum(p) );
    // save PI/PO counts
    Vec_StrPutI_ne( vStr, Tim_ManPiNum(p) );
    Vec_StrPutI_ne( vStr, Tim_ManPoNum(p) );
    // save number of boxes
    Vec_StrPutI_ne( vStr, Tim_ManBoxNum(p) );
    // for each box, save num_inputs, num_outputs, delay table ID, and copy field
    if ( Tim_ManBoxNum(p) > 0 )
    Tim_ManForEachBox( p, pBox, i )
    {
        Vec_StrPutI_ne( vStr, Tim_ManBoxInputNum(p, pBox->iBox) );
        Vec_StrPutI_ne( vStr, Tim_ManBoxOutputNum(p, pBox->iBox) );
        Vec_StrPutI_ne( vStr, Tim_ManBoxDelayTableId(p, pBox->iBox) ); // can be -1 if delay table is not given
        Vec_StrPutI_ne( vStr, Tim_ManBoxCopy(p, pBox->iBox) );         // can be -1 if the copy is node defined
        //Vec_StrPutI_ne( vStr, Tim_ManBoxIsBlack(p, pBox->iBox) );
    }
    if ( fHieOnly )
        return vStr;
    // save the number of delay tables
    Vec_StrPutI_ne( vStr, Tim_ManDelayTableNum(p) );
    // save the delay tables
    if ( Tim_ManDelayTableNum(p) > 0 )
    Tim_ManForEachTable( p, pDelayTable, i )
    {
        assert( (int)pDelayTable[0] == i );
        // save table ID and dimensions (inputs x outputs)
        Vec_StrPutI_ne( vStr, (int)pDelayTable[0] );
        Vec_StrPutI_ne( vStr, (int)pDelayTable[1] );
        Vec_StrPutI_ne( vStr, (int)pDelayTable[2] );
        // save table contents
        TableSize = (int)pDelayTable[1] * (int)pDelayTable[2];
        for ( k = 0; k < TableSize; k++ )
            Vec_StrPutF( vStr, pDelayTable[k+3] );
    }
    // save PI arrival times
    Tim_ManForEachPi( p, pObj, i )
        Vec_StrPutF( vStr, Tim_ManGetCiArrival(p, pObj->Id) );
    // save PO required times
    Tim_ManForEachPo( p, pObj, i )
        Vec_StrPutF( vStr, Tim_ManGetCoRequired(p, pObj->Id) );
    return vStr;
}